

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O3

DeepTiledOutputFile * __thiscall
Imf_3_4::MultiPartOutputFile::getOutputPart<Imf_3_4::DeepTiledOutputFile>
          (MultiPartOutputFile *this,int partNumber)

{
  _Rb_tree_header *p_Var1;
  pthread_mutex_t *__mutex;
  Data *pDVar2;
  int iVar3;
  _Base_ptr p_Var4;
  DeepTiledOutputFile *this_00;
  mapped_type *ppGVar5;
  ostream *poVar6;
  ArgExc *this_01;
  _Base_ptr p_Var7;
  stringstream _iex_throw_s;
  int local_1b4;
  pair<int,_Imf_3_4::GenericOutputFile_*> local_1b0;
  ostream local_1a0 [376];
  
  local_1b4 = partNumber;
  if ((partNumber < 0) ||
     (__mutex = (pthread_mutex_t *)this->_data,
     (int)((ulong)(*(long *)((long)__mutex + 0x90) - *(long *)((long)__mutex + 0x88)) >> 3) *
     -0x49249249 <= partNumber)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,"MultiPartOutputFile::getOutputPart called with invalid part number  ",0x44
              );
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,partNumber);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," on file with ",0xe);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," parts",6);
    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_01,(stringstream *)&local_1b0);
    __cxa_throw(this_01,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  pDVar2 = this->_data;
  p_Var4 = (pDVar2->_outputFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(pDVar2->_outputFiles)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = &p_Var1->_M_header;
    do {
      if (partNumber <= (int)p_Var4[1]._M_color) {
        p_Var7 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < partNumber];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var7 != p_Var1) && ((int)p_Var7[1]._M_color <= partNumber)) {
      ppGVar5 = std::
                map<int,_Imf_3_4::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_3_4::GenericOutputFile_*>_>_>
                ::operator[](&pDVar2->_outputFiles,&local_1b4);
      this_00 = (DeepTiledOutputFile *)*ppGVar5;
      goto LAB_00191636;
    }
  }
  this_00 = (DeepTiledOutputFile *)operator_new(0x10);
  DeepTiledOutputFile::DeepTiledOutputFile
            (this_00,(pDVar2->parts).
                     super__Vector_base<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[(uint)partNumber]);
  local_1b0.first = partNumber;
  local_1b0.second = (GenericOutputFile *)this_00;
  std::
  _Rb_tree<int,std::pair<int_const,Imf_3_4::GenericOutputFile*>,std::_Select1st<std::pair<int_const,Imf_3_4::GenericOutputFile*>>,std::less<int>,std::allocator<std::pair<int_const,Imf_3_4::GenericOutputFile*>>>
  ::_M_emplace_unique<std::pair<int,Imf_3_4::GenericOutputFile*>>
            ((_Rb_tree<int,std::pair<int_const,Imf_3_4::GenericOutputFile*>,std::_Select1st<std::pair<int_const,Imf_3_4::GenericOutputFile*>>,std::less<int>,std::allocator<std::pair<int_const,Imf_3_4::GenericOutputFile*>>>
              *)&this->_data->_outputFiles,&local_1b0);
LAB_00191636:
  pthread_mutex_unlock(__mutex);
  return this_00;
}

Assistant:

T*
MultiPartOutputFile::getOutputPart (int partNumber)
{

    if (partNumber < 0 || partNumber >= int (_data->_headers.size ()))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "MultiPartOutputFile::getOutputPart called with invalid part number  "
                << partNumber << " on file with " << _data->_headers.size ()
                << " parts");
    }

#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data);
#endif
    if (_data->_outputFiles.find (partNumber) == _data->_outputFiles.end ())
    {
        T* file = new T (_data->parts[partNumber]);
        _data->_outputFiles.insert (
            std::make_pair (partNumber, (GenericOutputFile*) file));
        return file;
    }
    else
        return (T*) _data->_outputFiles[partNumber];
}